

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_c.cpp
# Opt level: O0

void crotg(complex<float> *ca,complex<float> cb,float *c,complex<float> *s)

{
  complex<float> cVar1;
  float fVar2;
  complex<float> *in_XMM0_Qa;
  double dVar3;
  __type _Var4;
  __type _Var5;
  double dVar6;
  undefined8 extraout_XMM0_Qa;
  _ComplexT_conflict extraout_XMM0_Qa_00;
  complex<float> local_a0;
  complex<float> local_98 [2];
  _ComplexT_conflict local_88;
  _ComplexT_conflict local_80;
  float local_74 [7];
  complex<float> *local_58;
  _ComplexT_conflict local_50;
  complex<float> local_48;
  _ComplexT_conflict local_40;
  float local_38;
  float local_34;
  float scale;
  float norm;
  complex<float> alpha;
  complex<float> *s_local;
  float *c_local;
  complex<float> *ca_local;
  complex<float> cb_local;
  
  cVar1._M_value = (_ComplexT_conflict)&scale;
  alpha._M_value = (_ComplexT_conflict)c;
  ca_local = in_XMM0_Qa;
  std::complex<float>::complex((complex<float> *)cVar1._M_value,0.0,0.0);
  local_40 = ca->_M_value;
  fVar2 = cabs2(cVar1);
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    local_50 = ca->_M_value;
    fVar2 = cabs2(cVar1);
    local_58 = ca_local;
    local_38 = cabs2(cVar1);
    local_38 = fVar2 + local_38;
    dVar3 = (double)local_38;
    cVar1._M_value = (_ComplexT_conflict)ca;
    std::operator/(ca,&local_38);
    fVar2 = cabs2(cVar1);
    _Var4 = std::pow<float,int>(fVar2,2);
    cVar1._M_value = (_ComplexT_conflict)&ca_local;
    std::operator/((complex<float> *)&ca_local,&local_38);
    fVar2 = cabs2(cVar1);
    cVar1._M_value = 2;
    _Var5 = std::pow<float,int>(fVar2,2);
    dVar6 = sqrt(_Var4 + _Var5);
    local_34 = (float)(dVar3 * dVar6);
    local_80 = ca->_M_value;
    local_74[0] = cabs2(cVar1);
    cVar1._M_value = (_ComplexT_conflict)ca;
    std::operator/(ca,local_74);
    local_88 = ca->_M_value;
    fVar2 = cabs2(cVar1);
    *(float *)cb._M_value = fVar2 / local_34;
    std::conj<float>((complex<float> *)&ca_local);
    std::operator*((complex<float> *)&scale,&local_a0);
    std::operator/(local_98,&local_34);
    *(undefined8 *)alpha._M_value = extraout_XMM0_Qa;
    std::operator*((complex<float> *)&scale,&local_34);
    ca->_M_value = extraout_XMM0_Qa_00;
  }
  else {
    *(undefined4 *)cb._M_value = 0;
    std::complex<float>::complex(&local_48,1.0,0.0);
    *(_ComplexT_conflict *)alpha._M_value = local_48._M_value;
    ca->_M_value = (_ComplexT_conflict)ca_local;
  }
  return;
}

Assistant:

void crotg ( complex <float> *ca, complex <float> cb, float *c,
  complex <float> *s )

//****************************************************************************80
//
//  Purpose:
//
//    CROTG determines a Givens rotation.
//
//  Discussion:
//
//    This routine uses single precision complex arithmetic.
//
//    Given values A and B, this routine computes:
//
//    If A = 0:
//
//      R = B
//      C = 0
//      S = (1,0).
//
//    If A /= 0:
//
//      ALPHA = A / abs ( A )
//      NORM  = sqrt ( ( abs ( A ) )**2 + ( abs ( B ) )**2 )
//      R     = ALPHA * NORM
//      C     = abs ( A ) / NORM
//      S     = ALPHA * conj ( B ) / NORM
//
//    In either case, the computed numbers satisfy the equation:
//
//    (         C    S ) * ( A ) = ( R )
//    ( -conj ( S )  C )   ( B ) = ( 0 )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    31 March 2007
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for FORTRAN usage,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, pages 308-323, 1979.
//
//  Parameters:
//
//    Input/output, complex <float> *CA, on input, the value A.  On output,
//    the value R.
//
//    Input, complex <float> CB, the value B.
//
//    Output, float *C, the cosine of the Given rotation.
//
//    Output, complex <float> *S, the sine of the Givens rotation.
//
{
  complex <float> alpha;
  float norm;
  float scale;

  if ( cabs2 ( *ca ) == 0.0 )
  {
    *c = 0.0;
    *s = complex <float> ( 1.0, 0.0 );
    *ca = cb;
  }
  else
  {
    scale = cabs2 ( *ca ) + cabs2 ( cb );
    norm = scale * sqrt ( pow ( cabs2 ( *ca / scale ), 2 )
                        + pow ( cabs2 (  cb / scale ), 2 ) );
    alpha = *ca / cabs2 ( *ca );
    *c = cabs2 ( *ca ) / norm;
    *s = alpha * conj ( cb ) / norm;
    *ca = alpha * norm;
  }

  return;
}